

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O2

void __thiscall
cmVirtualDirectoryWatcher::~cmVirtualDirectoryWatcher(cmVirtualDirectoryWatcher *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~cmVirtualDirectoryWatcher() override { cmDeleteAll(this->Children); }